

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O2

void * mpp_enc_async_thread(void *data)

{
  RK_U32 *pRVar1;
  int *piVar2;
  byte *pbVar3;
  HalEncTask *task;
  RK_S32 *pRVar4;
  MppEncImpl *enc;
  MppEncRefFrmUsrCfg *pMVar5;
  EncImpl impl;
  EncRcTask *task_00;
  pthread_mutex_t *ppVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  MppEncRefMode MVar10;
  RK_S32 RVar11;
  MppThreadStatus MVar12;
  MPP_RET MVar13;
  RK_S32 RVar14;
  RK_U32 RVar15;
  EncAsyncTaskInfo *pEVar16;
  EncAsyncTaskInfo *__s;
  MppBuffer pvVar17;
  void *pvVar18;
  size_t sVar19;
  pthread_mutex_t *ppVar20;
  MppStopwatch pvVar21;
  MppMeta pvVar22;
  RK_S64 RVar23;
  uint uVar24;
  char *pcVar25;
  char *fmt;
  uint uVar26;
  MppPacket pvVar27;
  undefined8 uVar28;
  ushort uVar29;
  EncAsyncWait EVar30;
  MppFrame s;
  ulong uVar31;
  mpp_list *pkt_out;
  bool bVar32;
  bool bVar33;
  void *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  AutoMutex autolock;
  EncAsyncWait wait;
  Mpp *local_a8;
  MppPacket pkt;
  pthread_mutex_t *local_98;
  MppFrame local_90;
  MppPacket local_88;
  HalTaskHnd *local_80;
  MppThread *local_78;
  pthread_mutex_t *local_70;
  void *local_68;
  MppEncRefFrmUsrCfg *local_60;
  sem_t *local_58;
  pthread_mutex_t *local_50;
  sem_t *local_48;
  sem_t *local_40;
  void *local_38;
  
  enc = *(MppEncImpl **)((long)data + 0xb0);
  local_78 = enc->thread_enc;
  local_38 = data;
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","thread start\n","mpp_enc_async_thread");
  }
  wait.val = 0;
  local_70 = (pthread_mutex_t *)local_78->mMutexCond;
  local_40 = (sem_t *)&enc->cmd_start;
  local_48 = (sem_t *)&enc->cmd_done;
  local_60 = &enc->frm_cfg;
  local_50 = (pthread_mutex_t *)(local_78->mMutexCond + 3);
  local_58 = (sem_t *)&enc->enc_reset;
  local_80 = &enc->hnd;
LAB_001407ad:
  do {
    autolock.mEnabled = 1;
    autolock.mLock = (Mutex *)&local_70->__data;
    pthread_mutex_lock(local_70);
    MVar12 = MppThread::get_status(local_78,THREAD_WORK);
    EVar30 = wait;
    if (MVar12 != MPP_THREAD_RUNNING) {
      Mutex::Autolock::~Autolock(&autolock);
      do {
        MVar13 = try_proc_processing_task(enc,&wait);
      } while (MVar13 == MPP_OK);
      if (((byte)mpp_enc_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_enc","thread finish\n","mpp_enc_async_thread");
      }
      return (void *)0x0;
    }
    uVar26 = enc->notify_flag;
    RVar15 = 0;
    bVar33 = true;
    if (enc->reset_flag == 0) {
      if ((uVar26 & 0x10) != 0) {
        RVar15 = uVar26 & 0xffffffef;
        goto LAB_0014081f;
      }
      bVar32 = (wait.val & uVar26) != 0;
      bVar33 = bVar32 || wait.val == 0;
      pcVar25 = "wait";
      if (bVar32 || wait.val == 0) {
        pcVar25 = "work";
      }
    }
    else {
LAB_0014081f:
      pcVar25 = "work";
    }
    if (((byte)mpp_enc_debug & 0x10) != 0) {
      in_stack_ffffffffffffff20 =
           CONCAT44((int)(in_stack_ffffffffffffff20 >> 0x20),~wait.val & enc->status_flag);
      in_stack_ffffffffffffff18 =
           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),wait.val);
      _mpp_log_l(4,"mpp_enc","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_enc_async_wait",enc
                 ,(ulong)enc->status_flag,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,uVar26
                 ,pcVar25);
    }
    enc->status_flag = (RK_U32)EVar30;
    enc->notify_flag = RVar15;
    if (bVar33) {
      enc->work_count = enc->work_count + 1;
    }
    else {
      enc->wait_count = enc->wait_count + 1;
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","wait start\n","mpp_enc_async_thread");
      }
      MppThread::wait(local_78,(void *)0x0);
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","wait done\n","mpp_enc_async_thread");
      }
    }
    Mutex::Autolock::~Autolock(&autolock);
    if ((enc->cmd_send == enc->cmd_recv) && (enc->reset_flag == 0)) {
      pvVar18 = enc->mpp;
      if (enc->hnd == (HalTaskHnd)0x0) {
        hal_task_get_hnd(enc->tasks,0,local_80);
        if (enc->hnd != (HalTaskHnd)0x0) {
          EVar30.val = EVar30.val & 0xffef;
          uVar29 = (ushort)EVar30.val;
          wait.val._0_2_ = uVar29;
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","get hnd success\n","try_get_async_task");
          }
          if (enc->async != (EncAsyncTaskInfo *)0x0) {
            in_stack_ffffffffffffff18 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb6c);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "enc->async == __null","try_get_async_task",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
          }
          __s = (EncAsyncTaskInfo *)hal_task_hnd_get_data(enc->hnd);
          memset(__s,0,0x238);
          (__s->task).rc_task = &__s->rc;
          (__s->task).frm_cfg = &__s->usr;
          enc->async = __s;
          if (enc->hnd == (HalTaskHnd)0x0) {
            in_stack_ffffffffffffff18 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb77);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->hnd",
                       "try_get_async_task",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
            pEVar16 = enc->async;
            goto LAB_00140a57;
          }
          goto LAB_00140b8b;
        }
        wait.val = CONCAT22(wait.val._2_2_,(short)EVar30.val) | 0x10;
        uVar31 = 0xffffffffffffffff;
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","get hnd failed\n","try_get_async_task");
          goto LAB_0014114b;
        }
      }
      else {
        pEVar16 = enc->async;
        __s = pEVar16;
LAB_00140a57:
        uVar29 = (ushort)EVar30.val;
        if (pEVar16 == (EncAsyncTaskInfo *)0x0) {
          in_stack_ffffffffffffff18 =
               (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb78);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                     "try_get_async_task",in_stack_ffffffffffffff18);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
        }
LAB_00140b8b:
        local_88 = (__s->task).packet;
        local_90 = (__s->task).frame;
        if (local_90 == (MppFrame)0x0) {
          ppVar20 = *(pthread_mutex_t **)((long)pvVar18 + 0x10);
          if (ppVar20 != (pthread_mutex_t *)0x0) {
            autolock.mEnabled = 1;
            autolock.mLock = (Mutex *)ppVar20;
            pthread_mutex_lock(ppVar20);
            RVar14 = mpp_list::list_size((mpp_list *)&ppVar20->__data);
            if (RVar14 != 0) {
              mpp_list::del_at_head((mpp_list *)&ppVar20->__data,&local_90,8);
              pthread_cond_signal((pthread_cond_t *)(ppVar20 + 1));
              piVar2 = (int *)((long)pvVar18 + 0x2c);
              *piVar2 = *piVar2 + 1;
              if (local_90 == (MppFrame)0x0) {
                in_stack_ffffffffffffff18 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb8a);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                           "try_get_async_task",in_stack_ffffffffffffff18);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
              }
              *(byte *)&__s->status = *(byte *)&__s->status | 2;
              wait.val = CONCAT22(wait.val._2_2_,uVar29) & 0xfffffffe;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","get input frame success\n","try_get_async_task");
              }
              pvVar21 = mpp_frame_get_stopwatch(local_90);
              mpp_stopwatch_record(pvVar21,"encode task start");
              (__s->task).frame = local_90;
              uVar29 = uVar29 & 0xfffe;
            }
            Mutex::Autolock::~Autolock(&autolock);
            if (local_90 != (MppFrame)0x0) goto LAB_00140ba6;
          }
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","get input frame failed\n","try_get_async_task");
          }
          wait.val = CONCAT22(wait.val._2_2_,uVar29) | 1;
LAB_0014114b:
          uVar31 = 0xffffffffffffffff;
        }
        else {
LAB_00140ba6:
          if (local_88 == (MppPacket)0x0) {
            RVar14 = mpp_frame_has_meta(local_90);
            if (RVar14 != 0) {
              pvVar22 = mpp_frame_get_meta(local_90);
              mpp_meta_get_packet(pvVar22,KEY_OUTPUT_PACKET,&local_88);
            }
            if (local_88 != (MppPacket)0x0) {
              *(byte *)&__s->status = *(byte *)&__s->status | 4;
              wait.val = CONCAT22(wait.val._2_2_,uVar29) & 0xfffffff7;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","get output packet success\n","try_get_async_task");
              }
              (__s->task).packet = local_88;
            }
          }
          if (local_90 == (MppFrame)0x0) {
            in_stack_ffffffffffffff18 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbb0);
            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                       "try_get_async_task",in_stack_ffffffffffffff18);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
          }
          pvVar21 = mpp_frame_get_stopwatch(local_90);
          uVar26 = (__s->status).val;
          if ((uVar26 & 8) == 0) {
            RVar15 = enc->task_idx;
            enc->task_idx = RVar15 + 1;
            __s->seq_idx = RVar15;
            RVar23 = mpp_frame_get_pts((__s->task).frame);
            __s->pts = RVar23;
            (__s->task).stopwatch = pvVar21;
            s = (__s->task).frame;
            (__s->rc).frame = s;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task seq idx %d start\n","try_get_async_task",0);
              s = (__s->task).frame;
            }
            autolock._0_8_ = (__s->task).packet;
            (__s->task).input = (MppBuffer)0x0;
            (__s->task).output = (MppBuffer)0x0;
            if ((MppPacket)autolock._0_8_ == (MppPacket)0x0) {
              mpp_packet_new((MppPacket *)&autolock);
              (__s->task).packet = (MppPacket)autolock._0_8_;
            }
            else {
              pvVar17 = mpp_packet_get_buffer((MppPacket)autolock._0_8_);
              (__s->task).output = pvVar17;
            }
            if (s != (MppFrame)0x0) {
              RVar23 = mpp_frame_get_pts(s);
              pvVar17 = mpp_frame_get_buffer(s);
              (__s->task).input = pvVar17;
              mpp_packet_set_pts((MppPacket)autolock._0_8_,RVar23);
              uVar28 = autolock._0_8_;
              RVar23 = mpp_frame_get_dts(s);
              mpp_packet_set_dts((MppPacket)uVar28,RVar23);
              RVar15 = mpp_frame_get_eos(s);
              if (RVar15 == 0) {
                mpp_packet_clr_eos((MppPacket)autolock._0_8_);
              }
              else {
                mpp_packet_set_eos((MppPacket)autolock._0_8_);
              }
              if ((__s->task).input != (MppBuffer)0x0) {
                uVar26 = (__s->status).val | 8;
                (__s->status).val = uVar26;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task frame packet ready\n","try_get_async_task");
                  uVar26 = (__s->status).val;
                }
                goto LAB_00140f4e;
              }
            }
            mpp_stopwatch_record(pvVar21,"empty frame on check frm pkt");
            (__s->task).valid = 1;
            (__s->task).length = 0;
            (__s->task).flags.drop_by_fps = 1;
LAB_00140fbb:
            uVar31 = 0;
          }
          else {
LAB_00140f4e:
            uVar24 = __s->seq_idx;
            if ((uVar26 & 0x20) == 0) {
              MVar13 = rc_frm_check_drop(enc->rc_ctx,&__s->rc);
              if (MVar13 == MPP_OK) {
                *(byte *)&__s->status = *(byte *)&__s->status | 0x20;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d drop %d\n","try_get_async_task",(ulong)uVar24,
                             (ulong)(*(uint *)((long)&(__s->rc).frm + 4) & 1));
                }
                (__s->task).valid = 1;
                if (((__s->rc).frm.val & 0x100000000) != 0) {
                  mpp_stopwatch_record(pvVar21,"invalid on frame rate drop");
                  (__s->task).length = 0;
                  (__s->task).flags.drop_by_fps = 1;
                  goto LAB_00140fbb;
                }
                pMVar5 = (__s->task).frm_cfg;
                RVar15 = local_60->force_flag;
                RVar14 = local_60->force_idr;
                RVar7 = local_60->force_pskip;
                RVar8 = local_60->force_nonref;
                RVar9 = local_60->force_temporal_id;
                MVar10 = local_60->force_ref_mode;
                RVar11 = local_60->force_ref_arg;
                pMVar5->force_lt_idx = local_60->force_lt_idx;
                pMVar5->force_temporal_id = RVar9;
                pMVar5->force_ref_mode = MVar10;
                pMVar5->force_ref_arg = RVar11;
                pMVar5->force_flag = RVar15;
                pMVar5->force_idr = RVar14;
                pMVar5->force_pskip = RVar7;
                pMVar5->force_nonref = RVar8;
                local_60->force_flag = 0;
                goto LAB_0014102b;
              }
              pvVar18 = enc->mpp;
              local_a8 = (Mpp *)CONCAT44(local_a8._4_4_,MVar13);
              in_stack_ffffffffffffff18 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
              pcVar25 = "mpp %p rc_frm_check_drop:%-4d failed return %d";
              uVar28 = 0xbd4;
LAB_001414b3:
              _mpp_log_l(2,"mpp_enc",pcVar25,(char *)0x0,pvVar18,uVar28,in_stack_ffffffffffffff18);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d terminate\n","try_get_async_task",(ulong)uVar24);
              }
              pvVar18 = enc->mpp;
              mpp_stopwatch_record((__s->task).stopwatch,"encode task done");
              pvVar27 = (__s->task).packet;
              if (pvVar27 != (MppPacket)0x0) {
                pkt = pvVar27;
                mpp_packet_set_length(pvVar27,(ulong)(__s->task).length);
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","async_task_terminate",
                             (ulong)*(ushort *)((long)&(__s->rc).frm + 6),enc->task_pts);
                }
                ppVar20 = *(pthread_mutex_t **)((long)pvVar18 + 8);
                if (ppVar20 != (pthread_mutex_t *)0x0) {
                  if (enc->frame != (MppFrame)0x0) {
                    local_98 = ppVar20;
                    pvVar22 = mpp_packet_get_meta(pvVar27);
                    pvVar21 = mpp_frame_get_stopwatch(enc->frame);
                    mpp_stopwatch_record(pvVar21,"encode task terminate");
                    mpp_meta_set_frame(pvVar22,KEY_INPUT_FRAME,enc->frame);
                    enc->frame = (MppFrame)0x0;
                    ppVar20 = local_98;
                  }
                  autolock.mEnabled = 1;
                  autolock.mLock = (Mutex *)ppVar20;
                  pthread_mutex_lock(ppVar20);
                  mpp_list::add_at_tail((mpp_list *)&ppVar20->__data,&pkt,8);
                  piVar2 = (int *)((long)pvVar18 + 0x20);
                  *piVar2 = *piVar2 + 1;
                  pthread_cond_signal((pthread_cond_t *)(ppVar20 + 1));
                  if (pkt == (MppPacket)0x0) {
                    in_stack_ffffffffffffff18 =
                         (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xace);
                    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt",
                               "async_task_terminate",in_stack_ffffffffffffff18);
                    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
                  }
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","packet out ready\n","async_task_terminate");
                  }
                  Mutex::Autolock::~Autolock(&autolock);
                }
              }
              memset(__s,0,0x238);
              (__s->task).rc_task = &__s->rc;
              (__s->task).frm_cfg = &__s->usr;
              uVar31 = (ulong)local_a8 & 0xffffffff;
            }
            else {
LAB_0014102b:
              local_a8 = (Mpp *)&__s->task;
              if (((HalEncTask *)local_a8)->valid == 0) {
                in_stack_ffffffffffffff18 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbe7);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "hal_task->valid","try_get_async_task",in_stack_ffffffffffffff18);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
              }
              if (((uint)__s->status & 0x80) == 0) {
                local_98 = (pthread_mutex_t *)CONCAT44(local_98._4_4_,uVar24);
                pvVar17 = (__s->task).output;
                if (pvVar17 == (MppBuffer)0x0) {
                  uVar24 = ((enc->cfg).prep.height + 0xfU & 0xffffff0) *
                           ((enc->cfg).prep.width + 0xfU & 0xfffffff0);
                  pvVar18 = enc->mpp;
                  uVar26 = uVar24 * 3 >> 1;
                  if (enc->coding != MPP_VIDEO_CodingMJPEG) {
                    uVar26 = uVar24;
                  }
                  pvVar27 = (__s->task).packet;
                  autolock.mEnabled = 0;
                  autolock._4_4_ = 0;
                  if (uVar26 == 0) {
                    in_stack_ffffffffffffff18 =
                         (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb41);
                    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"size",
                               "check_async_pkt_buf",in_stack_ffffffffffffff18);
                    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
                  }
                  mpp_buffer_get_with_tag
                            (*(MppBufferGroup *)((long)pvVar18 + 0x38),(MppBuffer *)&autolock,
                             (ulong)uVar26,"mpp_enc","check_async_pkt_buf");
                  mpp_buffer_attach_dev_f("check_async_pkt_buf",(MppBuffer)autolock._0_8_,enc->dev);
                  if (autolock._0_8_ == 0) {
                    in_stack_ffffffffffffff18 =
                         (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xb44);
                    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"buffer",
                               "check_async_pkt_buf",in_stack_ffffffffffffff18);
                    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
                  }
                  enc->pkt_buf = (MppBuffer)autolock._0_8_;
                  pvVar18 = mpp_buffer_get_ptr_with_caller
                                      ((MppBuffer)autolock._0_8_,"check_async_pkt_buf");
                  *(void **)((long)pvVar27 + 8) = pvVar18;
                  *(void **)((long)pvVar27 + 0x10) = pvVar18;
                  sVar19 = mpp_buffer_get_size_with_caller
                                     ((MppBuffer)autolock._0_8_,"check_async_pkt_buf");
                  *(size_t *)((long)pvVar27 + 0x18) = sVar19;
                  *(undefined8 *)((long)pvVar27 + 0x20) = 0;
                  *(undefined8 *)((long)pvVar27 + 0x40) = autolock._0_8_;
                  (__s->task).output = (MppBuffer)autolock._0_8_;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    pvVar27 = (__s->task).packet;
                    pcVar25 = "create output pkt %p buf %p\n";
                    pvVar17 = (MppBuffer)autolock._0_8_;
                    goto LAB_001412b0;
                  }
                }
                else if (((byte)mpp_enc_debug & 0x20) != 0) {
                  pvVar27 = (__s->task).packet;
                  local_68 = mpp_packet_get_pos(pvVar27);
                  in_stack_ffffffffffffff20 = mpp_packet_get_length((__s->task).packet);
                  pcVar25 = "output to pkt %p buf %p pos %p length %d\n";
                  in_stack_ffffffffffffff18 = local_68;
LAB_001412b0:
                  _mpp_log_l(4,"mpp_enc",pcVar25,"check_async_pkt_buf",pvVar27,pvVar17);
                }
                *(byte *)&__s->status = *(byte *)&__s->status | 0x80;
                uVar24 = (uint)local_98;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d check pkt buffer success\n","try_get_async_task",
                             (ulong)local_98 & 0xffffffff);
                }
              }
              if ((__s->task).packet == (MppPacket)0x0) {
                in_stack_ffffffffffffff18 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbf0);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "hal_task->packet","try_get_async_task",in_stack_ffffffffffffff18);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
              }
              if ((__s->task).output == (MppBuffer)0x0) {
                in_stack_ffffffffffffff18 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xbf1);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "hal_task->output","try_get_async_task",in_stack_ffffffffffffff18);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
              }
              if (enc->hal_info_updated == 0) {
                update_enc_hal_info(enc);
                enc->hal_info_updated = 1;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d update enc hal info success\n",
                             "try_get_async_task",(ulong)uVar24);
                }
              }
              if (((uint)enc->hdr_status & 1) == 0) {
                enc_impl_gen_hdr(enc->impl,enc->hdr_pkt);
                sVar19 = mpp_packet_get_length(enc->hdr_pkt);
                enc->hdr_len = (RK_U32)sVar19;
                *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 1;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d update header length %d\n","try_get_async_task",
                             (ulong)uVar24,sVar19 & 0xffffffff);
                }
                mpp_packet_append((__s->task).packet,enc->hdr_pkt);
                RVar15 = enc->hdr_len;
                (__s->task).header_length = RVar15;
                pRVar1 = &(__s->task).length;
                *pRVar1 = *pRVar1 + RVar15;
                *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 8;
              }
              check_hal_task_pkt_len((HalEncTask *)local_a8,"gen_hdr and adding");
              uVar26 = (__s->status).val;
              if ((uVar26 >> 8 & 1) == 0) {
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc start\n","try_get_async_task",(ulong)uVar24);
                }
                MVar13 = enc_impl_start(enc->impl,(HalEncTask *)local_a8);
                if (MVar13 != MPP_OK) {
                  pvVar18 = enc->mpp;
                  local_a8 = (Mpp *)CONCAT44(local_a8._4_4_,MVar13);
                  in_stack_ffffffffffffff18 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
                  pcVar25 = "mpp %p enc_impl_start:%-4d failed return %d";
                  uVar28 = 0xc10;
                  goto LAB_001414b3;
                }
                uVar26 = (__s->status).val | 0x100;
                (__s->status).val = uVar26;
              }
              if ((uVar26 >> 9 & 1) == 0) {
                if ((__s->usr).force_flag != 0) {
                  mpp_enc_refs_set_usr_cfg(enc->refs,&__s->usr);
                  (__s->usr).force_flag = 0;
                }
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d refs force update success\n","try_get_async_task",
                             (ulong)uVar24);
                }
                uVar26 = (__s->status).val | 0x200;
                (__s->status).val = uVar26;
              }
              uVar31 = 0;
              if ((uVar26 >> 0xb & 1) == 0) {
                mpp_enc_refs_stash(enc->refs);
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d refs stash success\n","try_get_async_task",
                             (ulong)uVar24);
                }
                pbVar3 = (byte *)((long)&__s->status + 1);
                *pbVar3 = *pbVar3 | 8;
              }
            }
          }
        }
      }
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","try_get_async_task ret %d\n","mpp_enc_async_thread",
                   uVar31 & 0xffffffff);
      }
      if ((int)uVar31 == 0) {
        ppVar20 = (pthread_mutex_t *)enc->async;
        if (ppVar20 == (pthread_mutex_t *)0x0) {
          in_stack_ffffffffffffff18 =
               (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xd6f);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                     "mpp_enc_async_thread",in_stack_ffffffffffffff18);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
          ppVar20 = (pthread_mutex_t *)enc->async;
        }
        if (((HalEncTask *)&(ppVar20->__data).__kind)->valid == 0) {
          in_stack_ffffffffffffff18 =
               (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xd70);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "enc->async->task.valid","mpp_enc_async_thread",in_stack_ffffffffffffff18);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
          ppVar20 = (pthread_mutex_t *)enc->async;
          bVar33 = ((HalEncTask *)&(ppVar20->__data).__kind)->valid == 0;
        }
        else {
          bVar33 = false;
        }
        local_a8 = (Mpp *)enc->mpp;
        impl = enc->impl;
        ppVar6 = (pthread_mutex_t *)enc->enc_hal;
        task_00 = (EncRcTask *)(ppVar20->__data).__list.__prev;
        uVar26 = (ppVar20->__data).__lock;
        if (bVar33) {
          in_stack_ffffffffffffff18 =
               (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xc54);
          local_98 = ppVar20;
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->valid",
                     "proc_async_task",in_stack_ffffffffffffff18);
          ppVar20 = local_98;
          if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001420c3:
            abort();
          }
        }
        if (*(int *)((long)ppVar20 + 0xb4) == 0) {
          local_98 = ppVar6;
          if (((ppVar20->__data).__count & 0x40) == 0) {
            (ppVar20->__data).__count = (ppVar20->__data).__count | 0x40;
            mpp_enc_get_pskip_mode
                      ((Mpp *)enc->mpp,(EncAsyncTaskInfo *)&ppVar20->__data,
                       (MppPskipMode *)&autolock);
            if (autolock._4_4_ != 0 || autolock.mEnabled != 0) {
              MVar13 = mpp_enc_force_pskip((Mpp *)enc->mpp,(EncAsyncTaskInfo *)&ppVar20->__data);
              if (MVar13 == MPP_OK) goto LAB_001418b7;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","proc_async_task",
                           (ulong)*(ushort *)((long)&task_00->frm + 6));
              }
            }
          }
          if (((enc->support_hw_deflicker != 0) && ((enc->cfg).rc.debreath_en != 0)) &&
             (RVar14 = mpp_enc_refs_next_frm_is_intra(enc->refs), RVar14 != 0)) {
            do {
              MVar13 = try_proc_processing_task(enc,&wait);
            } while (MVar13 == MPP_OK);
            MVar13 = mpp_enc_proc_two_pass(local_a8,(EncAsyncTaskInfo *)&ppVar20->__data);
            if (MVar13 != MPP_OK) goto LAB_001407ad;
          }
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","proc_async_task",(ulong)uVar26);
          }
          mpp_enc_refs_get_cpb(enc->refs,(EncCpbStatus *)task_00);
          if ((mpp_enc_debug._2_1_ & 1) != 0) {
            _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                       "proc_async_task",(ulong)uVar26);
          }
          task = (HalEncTask *)((long)ppVar20 + 0x10);
          MVar13 = enc_impl_proc_dpb(impl,task);
          if (MVar13 == MPP_OK) {
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","proc_async_task",
                         (ulong)*(ushort *)((long)&task_00->frm + 6));
            }
            MVar13 = rc_frm_start(enc->rc_ctx,task_00);
            if (MVar13 == MPP_OK) {
              mpp_enc_add_sw_header(enc,task);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","proc_async_task",
                           (ulong)*(ushort *)((long)&task_00->frm + 6));
              }
              MVar13 = enc_impl_proc_hal(impl,task);
              if (MVar13 == MPP_OK) {
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d hal get task\n","proc_async_task",
                             (ulong)*(ushort *)((long)&task_00->frm + 6));
                }
                MVar13 = mpp_enc_hal_get_task(local_98,task);
                if (MVar13 == MPP_OK) {
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","proc_async_task",
                               (ulong)*(ushort *)((long)&task_00->frm + 6));
                  }
                  MVar13 = rc_hal_start(enc->rc_ctx,task_00);
                  if (MVar13 == MPP_OK) {
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","proc_async_task",
                                 (ulong)*(ushort *)((long)&task_00->frm + 6));
                    }
                    MVar13 = mpp_enc_hal_gen_regs(local_98,task);
                    if (MVar13 == MPP_OK) {
                      mpp_stopwatch_record
                                (*(MppStopwatch *)((long)ppVar20 + 0x80),"encode hal start");
                      if (((byte)mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d hal start\n","proc_async_task",
                                   (ulong)*(ushort *)((long)&task_00->frm + 6));
                      }
                      MVar13 = mpp_enc_hal_start(local_98,task);
                      if (MVar13 == MPP_OK) goto LAB_001418b7;
                      in_stack_ffffffffffffff18 =
                           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
                      pcVar25 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                      uVar28 = 0xc8e;
                    }
                    else {
                      in_stack_ffffffffffffff18 =
                           (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
                      pcVar25 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                      uVar28 = 0xc8a;
                    }
                  }
                  else {
                    in_stack_ffffffffffffff18 =
                         (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
                    pcVar25 = "mpp %p rc_hal_start:%-4d failed return %d";
                    uVar28 = 0xc87;
                  }
                }
                else {
                  in_stack_ffffffffffffff18 =
                       (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
                  pcVar25 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                  uVar28 = 0xc84;
                }
              }
              else {
                in_stack_ffffffffffffff18 =
                     (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
                pcVar25 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                uVar28 = 0xc81;
              }
            }
            else {
              in_stack_ffffffffffffff18 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
              pcVar25 = "mpp %p rc_frm_start:%-4d failed return %d";
              uVar28 = 0xc7b;
            }
          }
          else {
            in_stack_ffffffffffffff18 =
                 (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),MVar13);
            pcVar25 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
            uVar28 = 0xc78;
          }
          _mpp_log_l(2,"mpp_enc",pcVar25,(char *)0x0,local_a8,uVar28,in_stack_ffffffffffffff18);
        }
        else {
LAB_001418b7:
          ppVar20->__size[7] = ppVar20->__size[7] & 0xf7;
          hal_task_hnd_set_status(*local_80,1);
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d on processing ret %d\n","proc_async_task",
                       (ulong)*(ushort *)((long)&task_00->frm + 6),0);
          }
          *local_80 = (HalTaskHnd)0x0;
          local_80[1] = (EncAsyncTaskInfo *)0x0;
        }
        (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
        goto LAB_001407ad;
      }
      try_proc_processing_task(enc,&wait);
      goto LAB_001407ad;
    }
    ppVar20 = *(pthread_mutex_t **)((long)local_38 + 0x10);
    pthread_mutex_lock(ppVar20);
    if (((byte)mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_async_thread",(ulong)enc->cmd_recv,
                 (ulong)enc->cmd);
    }
    do {
      MVar13 = try_proc_processing_task(enc,&wait);
    } while (MVar13 == MPP_OK);
    if (enc->cmd_send == enc->cmd_recv) {
      if (enc->reset_flag != 0) {
        if (((byte)mpp_enc_debug & 0x20) == 0) goto LAB_00141d41;
        fmt = "thread reset start\n";
        pcVar25 = "mpp_enc_async_thread";
        do {
          _mpp_log_l(4,"mpp_enc",fmt,pcVar25);
LAB_00141d41:
          do {
            RVar14 = mpp_list::list_size((mpp_list *)&ppVar20->__data);
            if (RVar14 == 0) {
              autolock.mEnabled = 1;
              autolock.mLock = (Mutex *)&local_70->__data;
              pthread_mutex_lock(local_70);
              enc->status_flag = 0;
              Mutex::Autolock::~Autolock(&autolock);
              *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
              pRVar4 = &(enc->frm_cfg).force_idr;
              *pRVar4 = *pRVar4 + 1;
              autolock.mEnabled = 1;
              autolock.mLock = (Mutex *)&local_50->__data;
              pthread_mutex_lock(local_50);
              enc->reset_flag = 0;
              sem_post(local_58);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_async_thread");
              }
              Mutex::Autolock::~Autolock(&autolock);
              goto LAB_0014205a;
            }
            pvVar18 = enc->mpp;
            autolock.mEnabled = 0;
            autolock._4_4_ = 0;
            pkt = (MppPacket)0x0;
            mpp_list::del_at_head(*(mpp_list **)((long)pvVar18 + 0x10),&autolock,8);
            *(int *)((long)pvVar18 + 0x2c) = *(int *)((long)pvVar18 + 0x2c) + 1;
            if (autolock._0_8_ == 0) {
              in_stack_ffffffffffffff18 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xae2);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"frm",
                         "async_task_skip",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
            }
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","skip input frame start\n","async_task_skip");
            }
            pvVar21 = mpp_frame_get_stopwatch((MppFrame)autolock._0_8_);
            mpp_stopwatch_record(pvVar21,"skip task start");
            RVar14 = mpp_frame_has_meta((MppFrame)autolock._0_8_);
            if ((RVar14 != 0) &&
               (pvVar22 = mpp_frame_get_meta((MppFrame)autolock._0_8_), pvVar22 != (MppMeta)0x0)) {
              mpp_meta_get_packet(pvVar22,KEY_OUTPUT_PACKET,&pkt);
            }
            if ((pkt == (MppPacket)0x0) && (mpp_packet_new(&pkt), pkt == (MppPacket)0x0)) {
              in_stack_ffffffffffffff18 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xaf2);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"pkt",
                         "async_task_skip",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
            }
            mpp_packet_set_length(pkt,0);
            pvVar27 = pkt;
            RVar23 = mpp_frame_get_pts((MppFrame)autolock._0_8_);
            mpp_packet_set_pts(pvVar27,RVar23);
            pvVar27 = pkt;
            RVar23 = mpp_frame_get_dts((MppFrame)autolock._0_8_);
            mpp_packet_set_dts(pvVar27,RVar23);
            RVar15 = mpp_frame_get_eos((MppFrame)autolock._0_8_);
            if (RVar15 == 0) {
              mpp_packet_clr_eos(pkt);
            }
            else {
              mpp_packet_set_eos(pkt);
            }
            pvVar22 = mpp_packet_get_meta(pkt);
            if (pvVar22 == (MppMeta)0x0) {
              in_stack_ffffffffffffff18 =
                   (void *)CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),0xafe);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"meta",
                         "async_task_skip",in_stack_ffffffffffffff18);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001420c3;
            }
            mpp_meta_set_frame(pvVar22,KEY_INPUT_FRAME,(MppFrame)autolock._0_8_);
            ppVar6 = *(pthread_mutex_t **)((long)pvVar18 + 8);
            if (ppVar6 != (pthread_mutex_t *)0x0) {
              pthread_mutex_lock(ppVar6);
              mpp_stopwatch_record(pvVar21,"skip task output");
              mpp_list::add_at_tail((mpp_list *)&ppVar6->__data,&pkt,8);
              *(int *)((long)pvVar18 + 0x20) = *(int *)((long)pvVar18 + 0x20) + 1;
              pthread_cond_signal((pthread_cond_t *)(ppVar6 + 1));
              pthread_mutex_unlock(ppVar6);
            }
          } while (((byte)mpp_enc_debug & 0x20) == 0);
          fmt = "packet skip ready\n";
          pcVar25 = "async_task_skip";
        } while( true );
      }
    }
    else {
      sem_wait(local_40);
      MVar13 = mpp_enc_proc_cfg(enc,enc->cmd,enc->param);
      if (MVar13 != MPP_OK) {
        *enc->cmd_ret = MVar13;
      }
      uVar26 = enc->cmd_recv + 1;
      enc->cmd_recv = uVar26;
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_async_thread",(ulong)uVar26,
                   (ulong)enc->cmd_send);
      }
      enc->param = (void *)0x0;
      enc->cmd = 0;
      sem_post(local_48);
      mpp_enc_hal_prepare(enc->enc_hal);
      mpp_enc_proc_rc_update(enc);
    }
LAB_0014205a:
    pthread_mutex_unlock(ppVar20);
    wait.val = 0;
  } while( true );
}

Assistant:

void *mpp_enc_async_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc = enc->thread_enc;
    EncAsyncWait wait;
    MPP_RET ret = MPP_OK;

    enc_dbg_func("thread start\n");

    wait.val = 0;

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_async_wait(enc, &wait)) {
                enc_dbg_detail("wait start\n");
                thd_enc->wait();
                enc_dbg_detail("wait done\n");
            }
        }

        // When encoder is not on encoding process external config and reset
        // 1. process user control and reset flag
        if (enc->cmd_send != enc->cmd_recv || enc->reset_flag) {
            mpp_list *frm_in = mpp->mFrmIn;

            /* when process cmd or reset hold frame input */
            frm_in->lock();

            enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);

            // wait all tasks done
            while (MPP_OK == try_proc_processing_task(enc, &wait));

            if (enc->cmd_send != enc->cmd_recv) {
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                goto SYNC_DONE;
            }

            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");

                /* skip the frames in input queue */
                while (frm_in->list_size())
                    async_task_skip(enc);

                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
            }
        SYNC_DONE:
            frm_in->unlock();
            wait.val = 0;
            continue;
        }

        // 2. try get a task to encode
        ret = try_get_async_task(enc, &wait);
        enc_dbg_detail("try_get_async_task ret %d\n", ret);
        if (ret) {
            try_proc_processing_task(enc, &wait);
            continue;
        }

        mpp_assert(enc->async);
        mpp_assert(enc->async->task.valid);

        proc_async_task(enc, &wait);
    }
    /* wait all task done */
    while (MPP_OK == try_proc_processing_task(enc, &wait));

    enc_dbg_func("thread finish\n");

    return NULL;
}